

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPRThreadPoolTest1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  function *pfVar1;
  ostream *this;
  int i;
  ThreadPool *pool;
  ThreadFunc *in_stack_ffffffffffffff28;
  ThreadPool *in_stack_ffffffffffffff30;
  _Bind<void_(*(thread::ThreadPool_*))(thread::ThreadPool_*)> *in_stack_ffffffffffffff38;
  function<void_()> *this_00;
  _Bind<void_(*(thread::ThreadPool_*))(thread::ThreadPool_*)> local_88 [2];
  int in_stack_ffffffffffffff9c;
  int iVar2;
  ThreadPool *in_stack_ffffffffffffffa0;
  function<void_()> local_58 [2];
  function *local_18;
  undefined4 local_4;
  
  local_4 = 0;
  pfVar1 = (function *)operator_new(0xe8);
  thread::ThreadPool::ThreadPool(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  this_00 = local_58;
  local_18 = pfVar1;
  std::bind<void(*)(thread::ThreadPool*),thread::ThreadPool*&>
            (&in_stack_ffffffffffffff38->_M_f,(ThreadPool **)in_stack_ffffffffffffff30);
  std::function<void()>::
  function<std::_Bind<void(*(thread::ThreadPool*))(thread::ThreadPool*)>,void>
            (this_00,in_stack_ffffffffffffff38);
  thread::ThreadPool::setThreadCallBack(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::function<void_()>::~function((function<void_()> *)0x1064dc);
  thread::ThreadPool::start();
  for (iVar2 = 0; iVar2 < 10; iVar2 = iVar2 + 1) {
    pfVar1 = local_18;
    std::bind<void(*)(int),int&>((_func_void_int **)in_stack_ffffffffffffff38,(int *)local_18);
    in_stack_ffffffffffffff38 = local_88;
    std::function<void()>::function<std::_Bind<void(*(int))(int)>,void>
              (this_00,(_Bind<void_(*(int))(int)> *)in_stack_ffffffffffffff38);
    thread::ThreadPool::addInTaskQueue(pfVar1);
    std::function<void_()>::~function((function<void_()> *)0x10655b);
    sleep(1);
  }
  thread::ThreadPool::joinAll();
  this = std::operator<<((ostream *)&std::cout,"sleep~");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  sleep(2);
  return 0;
}

Assistant:

int main(int argc,char** argv)
{

    thread::ThreadPool* pool = new thread::ThreadPool(2);
    
    pool->setThreadCallBack(std::bind(&print,pool));

    pool->start();

    for(int i=0;i<10;++i)
    {
        pool->addInTaskQueue(std::bind(&fs,i));
        sleep(1);
    }

    pool->joinAll();

    std::cout << "sleep~" << std::endl;
    sleep(2);

    return 0;
}